

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alSourcei(void)

{
  uint32 name_00;
  ALenum param_00;
  int32 value_00;
  ALint value;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    value_00 = IO_INT32();
    if (io_failure == 0) {
      visit_alSourcei((CallerInfo *)&param,name_00,param_00,value_00);
    }
  }
  return;
}

Assistant:

static void decode_alSourcei(void)
{
#pragma warning AL_LOOPING is bool, others might be enum
    IO_START(alSourcei);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    const ALint value = IO_INT32();
    if (!io_failure) visit_alSourcei(&callerinfo, name, param, value);
    IO_END();
}